

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O3

_Bool fy_emit_token_write_block_hints
                (fy_emitter *emit,fy_token *fyt,int flags,int indent,char *chompp)

{
  uint uVar1;
  fy_atom *pfVar2;
  int iVar3;
  _Bool _Var4;
  
  pfVar2 = fy_token_atom(fyt);
  if (pfVar2 == (fy_atom *)0x0) {
    *(byte *)&emit->flags = (byte)emit->flags & 0xfb;
    iVar3 = 0x2d;
    _Var4 = false;
  }
  else {
    uVar1 = *(uint *)&pfVar2->field_0x34;
    _Var4 = (uVar1 & 0x18000) != 0;
    if (_Var4) {
      uVar1 = emit->cfg->flags >> 8 & 0xf;
      iVar3 = 0x32;
      if (uVar1 != 0) {
        iVar3 = uVar1 + 0x30;
      }
      fy_emit_putc(emit,fyewt_indicator,iVar3);
      uVar1 = *(uint *)&pfVar2->field_0x34;
    }
    if ((uVar1 >> 0x12 & 1) == 0) {
      *(byte *)&emit->flags = (byte)emit->flags & 0xfb;
      iVar3 = 0x2d;
    }
    else {
      if ((uVar1 >> 0x13 & 1) == 0) {
        emit->flags = emit->flags & 0xfffffffb;
        iVar3 = 0;
        goto LAB_00127475;
      }
      emit->flags = emit->flags | 4;
      iVar3 = 0x2b;
    }
  }
  fy_emit_putc(emit,fyewt_indicator,iVar3);
LAB_00127475:
  *chompp = (char)iVar3;
  return _Var4;
}

Assistant:

bool
fy_emit_token_write_block_hints(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent, char *chompp) {
    char chomp = '\0';
    bool explicit_chomp = false;
    struct fy_atom *atom;

    atom = fy_token_atom(fyt);
    if (!atom) {
        emit->flags &= ~FYEF_OPEN_ENDED;
        chomp = '-';
        goto out;
    }

    if (atom->starts_with_ws || atom->starts_with_lb) {
        fy_emit_putc(emit, fyewt_indicator, '0' + fy_emit_indent(emit));
        explicit_chomp = true;
    }

    if (!atom->ends_with_lb) {
        emit->flags &= ~FYEF_OPEN_ENDED;
        chomp = '-';
        goto out;
    }

    if (atom->trailing_lb) {
        emit->flags |= FYEF_OPEN_ENDED;
        chomp = '+';
        goto out;
    }
    emit->flags &= ~FYEF_OPEN_ENDED;

    out:
    if (chomp)
        fy_emit_putc(emit, fyewt_indicator, chomp);
    *chompp = chomp;
    return explicit_chomp;
}